

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O0

void __thiscall
Assimp::IFC::anon_unknown_9::Line::SampleDiscrete(Line *this,TempMesh *out,IfcFloat a,IfcFloat b)

{
  IfcFloat IVar1;
  bool bVar2;
  size_type sVar3;
  value_type local_70;
  value_type local_58;
  value_type local_40;
  IfcFloat local_28;
  IfcFloat b_local;
  IfcFloat a_local;
  TempMesh *out_local;
  Line *this_local;
  
  local_28 = b;
  b_local = a;
  a_local = (IfcFloat)out;
  out_local = (TempMesh *)this;
  bVar2 = Curve::InRange(&this->super_Curve,a);
  if (!bVar2) {
    __assert_fail("InRange( a )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0xb4,
                  "virtual void Assimp::IFC::(anonymous namespace)::Line::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
                 );
  }
  bVar2 = Curve::InRange(&this->super_Curve,local_28);
  IVar1 = a_local;
  if (!bVar2) {
    __assert_fail("InRange( b )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0xb5,
                  "virtual void Assimp::IFC::(anonymous namespace)::Line::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
                 );
  }
  if ((b_local != local_28) || (NAN(b_local) || NAN(local_28))) {
    sVar3 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                      ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)a_local);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)IVar1,sVar3 + 2);
    IVar1 = a_local;
    (*(this->super_Curve)._vptr_Curve[3])(b_local,&local_58);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)IVar1,&local_58);
    IVar1 = a_local;
    (*(this->super_Curve)._vptr_Curve[3])(local_28,&local_70);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)IVar1,&local_70);
  }
  else {
    (*(this->super_Curve)._vptr_Curve[3])(b_local,&local_40);
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)IVar1,&local_40);
  }
  return;
}

Assistant:

void SampleDiscrete(TempMesh& out,IfcFloat a, IfcFloat b) const {
        ai_assert( InRange( a ) );
        ai_assert( InRange( b ) );

        if (a == b) {
            out.mVerts.push_back(Eval(a));
            return;
        }
        out.mVerts.reserve(out.mVerts.size()+2);
        out.mVerts.push_back(Eval(a));
        out.mVerts.push_back(Eval(b));
    }